

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

uint32_t __thiscall
asmjit::ZoneVector<asmjit::Pass_*>::indexOf(ZoneVector<asmjit::Pass_*> *this,Pass **val)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if ((this->super_ZoneVectorBase)._size == uVar1) {
      return 0xffffffff;
    }
    if (*(Pass **)((long)(this->super_ZoneVectorBase)._data + uVar1 * 8) == *val) break;
    uVar1 = uVar1 + 1;
  }
  return (uint32_t)uVar1;
}

Assistant:

inline uint32_t indexOf(const T& val) const noexcept {
    const T* data = static_cast<const T*>(_data);
    uint32_t size = _size;

    for (uint32_t i = 0; i < size; i++)
      if (data[i] == val)
        return i;
    return Globals::kNotFound;
  }